

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

int cgltf_parse_json_nodes
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_data *out_data)

{
  ulong local_40;
  cgltf_size j;
  cgltf_data *out_data_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  cgltf_options *options_local;
  
  json_chunk_local._4_4_ =
       cgltf_parse_json_array
                 (options,tokens,i,json_chunk,0xf0,&out_data->nodes,&out_data->nodes_count);
  options_local._4_4_ = json_chunk_local._4_4_;
  if (-1 < json_chunk_local._4_4_) {
    for (local_40 = 0; local_40 < out_data->nodes_count; local_40 = local_40 + 1) {
      json_chunk_local._4_4_ =
           cgltf_parse_json_node
                     (options,tokens,json_chunk_local._4_4_,json_chunk,out_data->nodes + local_40);
      if (json_chunk_local._4_4_ < 0) {
        return json_chunk_local._4_4_;
      }
    }
    options_local._4_4_ = json_chunk_local._4_4_;
  }
  return options_local._4_4_;
}

Assistant:

static int cgltf_parse_json_nodes(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_data* out_data)
{
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(cgltf_node), (void**)&out_data->nodes, &out_data->nodes_count);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < out_data->nodes_count; ++j)
	{
		i = cgltf_parse_json_node(options, tokens, i, json_chunk, &out_data->nodes[j]);
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}